

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Function>::moveAppend
          (QGenericArrayOps<Function> *this,Function *b,Function *e)

{
  qsizetype *pqVar1;
  Function *pFVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pFVar2 = (this->super_QArrayDataPointer<Function>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<Function>).size;
      pDVar4 = (b->className).d.d;
      (b->className).d.d = (Data *)0x0;
      pFVar2[lVar3].className.d.d = pDVar4;
      pcVar5 = (b->className).d.ptr;
      (b->className).d.ptr = (char16_t *)0x0;
      pFVar2[lVar3].className.d.ptr = pcVar5;
      qVar6 = (b->className).d.size;
      (b->className).d.size = 0;
      pFVar2[lVar3].className.d.size = qVar6;
      pDVar4 = (b->functionName).d.d;
      (b->functionName).d.d = (Data *)0x0;
      pFVar2[lVar3].functionName.d.d = pDVar4;
      pcVar5 = (b->functionName).d.ptr;
      (b->functionName).d.ptr = (char16_t *)0x0;
      pFVar2[lVar3].functionName.d.ptr = pcVar5;
      qVar6 = (b->functionName).d.size;
      (b->functionName).d.size = 0;
      pFVar2[lVar3].functionName.d.size = qVar6;
      pDVar4 = (b->functionParameters).d.d;
      (b->functionParameters).d.d = (Data *)0x0;
      pFVar2[lVar3].functionParameters.d.d = pDVar4;
      pcVar5 = (b->functionParameters).d.ptr;
      (b->functionParameters).d.ptr = (char16_t *)0x0;
      pFVar2[lVar3].functionParameters.d.ptr = pcVar5;
      qVar6 = (b->functionParameters).d.size;
      (b->functionParameters).d.size = 0;
      pFVar2[lVar3].functionParameters.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<Function>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }